

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

ClockingSkew slang::ast::ClockingSkew::fromSyntax(ClockingSkewSyntax *syntax,ASTContext *context)

{
  SourceRange range;
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  DelayControl *pDVar3;
  socklen_t __len;
  RandomizeDetails *in_RSI;
  AssertionInstanceDetails *in_RDI;
  ClockingSkew CVar4;
  ConstantValue cv;
  ClockingSkew result;
  Expression *in_stack_000002f8;
  ASTContext *in_stack_00000300;
  bitmask<slang::ast::EvalFlags> in_stack_0000030f;
  Expression *value;
  ASTContext *this;
  undefined7 in_stack_ffffffffffffff80;
  bitmask<slang::ast::EvalFlags> local_49;
  ASTContext local_48;
  ClockingSkew local_10;
  
  local_48.randomizeDetails = in_RSI;
  local_48.assertionInstance = in_RDI;
  ClockingSkew(&local_10);
  local_10.edge =
       SemanticFacts::getEdgeKind
                 ((TokenKind)
                  ((local_48.assertionInstance)->argumentMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                  .arrays.groups_size_index);
  if (((local_48.assertionInstance)->argumentMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
      .arrays.groups_ != (group_type_pointer)0x0) {
    iVar2 = TimingControl::bind((int)((local_48.assertionInstance)->argumentMap).table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                     .arrays.groups_,(sockaddr *)local_48.randomizeDetails,__len);
    local_10.delay = (TimingControl *)CONCAT44(extraout_var,iVar2);
    if ((local_10.delay)->kind == Delay) {
      pDVar3 = TimingControl::as<slang::ast::DelayControl>(local_10.delay);
      value = pDVar3->expr;
      local_49.m_bits = '\0';
      bitmask<slang::ast::EvalFlags>::bitmask(&local_49);
      this = &local_48;
      ASTContext::eval(in_stack_00000300,in_stack_000002f8,in_stack_0000030f);
      uVar1 = slang::ConstantValue::isInteger((ConstantValue *)0x91aefb);
      if ((bool)uVar1) {
        slang::ConstantValue::integer((ConstantValue *)0x91af21);
        range.startLoc._7_1_ = uVar1;
        range.startLoc._0_7_ = in_stack_ffffffffffffff80;
        range.endLoc = ((local_10.delay)->sourceRange).startLoc;
        ASTContext::requirePositive(this,(SVInt *)value,range);
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x91af79);
    }
  }
  CVar4._4_4_ = 0;
  CVar4.edge = local_10.edge;
  CVar4.delay = local_10.delay;
  return CVar4;
}

Assistant:

ClockingSkew ClockingSkew::fromSyntax(const ClockingSkewSyntax& syntax, const ASTContext& context) {
    ClockingSkew result;
    result.edge = SemanticFacts::getEdgeKind(syntax.edge.kind);

    if (syntax.delay) {
        result.delay = &TimingControl::bind(*syntax.delay, context);
        if (result.delay->kind == TimingControlKind::Delay) {
            auto cv = context.eval(result.delay->as<DelayControl>().expr);
            if (cv.isInteger())
                context.requirePositive(cv.integer(), result.delay->sourceRange);
        }
    }

    return result;
}